

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

node_t multiplicative_expression(void)

{
  uint id;
  node_t left;
  node_t right;
  char *pcVar1;
  int op;
  
  left = unary_expression();
  if (left != (node_t)0x0) {
    while( true ) {
      id = t->id;
      if (0x2f < (ulong)id) {
        return left;
      }
      if ((0x842000000000U >> ((ulong)id & 0x3f) & 1) == 0) {
        return left;
      }
      next();
      right = unary_expression();
      if (right == (node_t)0x0) break;
      left = binop(id,left,right);
    }
    pcVar1 = token_name(id);
    err(E,"expected expression after %s ",pcVar1);
  }
  return (node_t)0x0;
}

Assistant:

node_t multiplicative_expression()
{
    node_t n = NULL;
    if ((n = cast_expression()))
    {
        while (t->id == '*' || t->id == '/' || t->id == '%')
        {
            node_t right = NULL;
            int op = t->id;
            next();
            if (!(right = cast_expression()))
            {
                err(E, "expected expression after %s ", token_name(op));
                return NULL;
            }

            n = binop(op, n, right);
        }
        return n;
    }
    return NULL;
}